

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O0

Instance *
embree::createInstance(RTCScene scene,RTCScene object,int geomID,Vec3fa *lower,Vec3fa *upper)

{
  undefined8 uVar1;
  RTCTraversable pRVar2;
  RTCGeometry pRVar3;
  undefined8 *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R8;
  Instance *instance;
  size_t in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  Instance *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  undefined8 local_158;
  undefined8 local_150;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined8 *local_138;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined8 *local_108;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined1 *local_f0;
  undefined1 *local_e8;
  Vector *local_e0;
  undefined8 *local_d8;
  Vector *local_d0;
  undefined8 *local_c8;
  Vector *local_c0;
  undefined8 *local_b8;
  AffineSpace3fa *local_b0;
  undefined8 *local_a8;
  Vec3fa *local_a0;
  undefined8 *local_98;
  Vec3fa *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_170 = in_R8;
  local_168 = in_RCX;
  local_158 = in_RSI;
  local_150 = in_RDI;
  local_178 = (Instance *)
              alignedUSMMalloc(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,DEFAULT);
  local_178->type = USER_GEOMETRY_INSTANCE;
  pRVar2 = (RTCTraversable)rtcGetSceneTraversable(local_158);
  local_178->object = pRVar2;
  local_90 = &local_178->lower;
  local_98 = local_168;
  uVar1 = local_168[1];
  *(undefined8 *)&local_90->field_0 = *local_168;
  *(undefined8 *)((long)&(local_178->lower).field_0 + 8) = uVar1;
  local_a0 = &local_178->upper;
  local_a8 = local_170;
  uVar1 = local_170[1];
  *(undefined8 *)&local_a0->field_0 = *local_170;
  *(undefined8 *)((long)&(local_178->upper).field_0 + 8) = uVar1;
  local_138 = &local_188;
  local_13c = 0x3f800000;
  local_140 = 0;
  local_144 = 0;
  local_4 = 0;
  local_8 = 0;
  local_c = 0;
  local_10 = 0x3f800000;
  local_28 = 0x3f800000;
  uStack_20 = 0;
  local_188 = 0x3f800000;
  uStack_180 = 0;
  local_b0 = &local_178->local2world;
  *(undefined8 *)&(local_b0->l).vx.field_0 = 0x3f800000;
  *(undefined8 *)((long)&(local_178->local2world).l.vx.field_0 + 8) = 0;
  local_120 = &local_198;
  local_124 = 0;
  local_128 = 0x3f800000;
  local_12c = 0;
  local_2c = 0;
  local_30 = 0;
  local_34 = 0x3f800000;
  local_38 = 0;
  local_48 = 0x3f80000000000000;
  uStack_40 = 0;
  local_198 = 0x3f80000000000000;
  uStack_190 = 0;
  local_c0 = &(local_178->local2world).l.vy;
  *(undefined8 *)&local_c0->field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(local_178->local2world).l.vy.field_0 + 8) = 0;
  local_108 = &local_1a8;
  local_10c = 0;
  local_110 = 0;
  local_114 = 0x3f800000;
  local_4c = 0;
  local_50 = 0x3f800000;
  local_54 = 0;
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0x3f800000;
  local_1a8 = 0;
  uStack_1a0 = 0x3f800000;
  local_d0 = &(local_178->local2world).l.vz;
  *(undefined8 *)&local_d0->field_0 = 0;
  *(undefined8 *)((long)&(local_178->local2world).l.vz.field_0 + 8) = 0x3f800000;
  local_f4 = 0;
  local_f8 = 0;
  local_fc = 0;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_e0 = &(local_178->local2world).p;
  (local_e0->field_0).m128[0] = 0.0;
  (local_178->local2world).p.field_0.m128[1] = 0.0;
  (local_178->local2world).p.field_0.m128[2] = 0.0;
  (local_178->local2world).p.field_0.m128[3] = 0.0;
  local_f0 = &stack0xfffffffffffffe48;
  local_e8 = &stack0xfffffffffffffe48;
  local_d8 = local_108;
  local_c8 = local_120;
  local_b8 = local_138;
  pRVar3 = (RTCGeometry)rtcNewGeometry(g_device,0x78);
  local_178->geometry = pRVar3;
  rtcSetGeometryUserPrimitiveCount(local_178->geometry,1);
  rtcSetGeometryUserData(local_178->geometry,local_178);
  rtcSetGeometryBoundsFunction(local_178->geometry,instanceBoundsFunc,0);
  rtcSetGeometryIntersectFunction(local_178->geometry,instanceIntersectFuncPtr);
  rtcSetGeometryOccludedFunction(local_178->geometry,instanceOccludedFuncPtr);
  rtcCommitGeometry(local_178->geometry);
  rtcAttachGeometry(local_150,local_178->geometry);
  rtcReleaseGeometry(local_178->geometry);
  return local_178;
}

Assistant:

Instance* createInstance (RTCScene scene, RTCScene object, int geomID, const Vec3fa& lower, const Vec3fa& upper)
{
#if !ENABLE_NATIVE_INSTANCING
  Instance* instance = (Instance*) alignedUSMMalloc(sizeof(Instance),16);
  instance->type = USER_GEOMETRY_INSTANCE;
  instance->object = rtcGetSceneTraversable(object);
  instance->lower = lower;
  instance->upper = upper;
  instance->local2world.l.vx = Vec3fa(1,0,0);
  instance->local2world.l.vy = Vec3fa(0,1,0);
  instance->local2world.l.vz = Vec3fa(0,0,1);
  instance->local2world.p    = Vec3fa(0,0,0);
  instance->geometry = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_USER);
  rtcSetGeometryUserPrimitiveCount(instance->geometry,1);
  rtcSetGeometryUserData(instance->geometry,instance);
  rtcSetGeometryBoundsFunction(instance->geometry,instanceBoundsFunc,nullptr);
  rtcSetGeometryIntersectFunction(instance->geometry,instanceIntersectFuncPtr);
  rtcSetGeometryOccludedFunction (instance->geometry,instanceOccludedFuncPtr);
  rtcCommitGeometry(instance->geometry);
  rtcAttachGeometry(scene,instance->geometry);
  rtcReleaseGeometry(instance->geometry);
  return instance;
#else
  Instance* instance = (Instance*) alignedUSMMalloc(sizeof(Instance),16);
  instance->type = USER_GEOMETRY_INSTANCE;
  instance->geometry = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(instance->geometry,object);
  rtcSetGeometryTimeStepCount(instance->geometry,1);
  rtcCommitGeometry(instance->geometry);
  rtcAttachGeometryByID(scene,instance->geometry,geomID);
  rtcReleaseGeometry(instance->geometry);
  return instance;
#endif
}